

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# receive.cpp
# Opt level: O2

CAmount wallet::OutputGetChange(CWallet *wallet,CTxOut *txout)

{
  bool bVar1;
  CAmount CVar2;
  runtime_error *this;
  long in_FS_OFFSET;
  allocator<char> local_61;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((ulong)txout->nValue < 0x775f05a074001) {
    bVar1 = ScriptIsChange(wallet,&txout->scriptPubKey);
    if (bVar1) {
      CVar2 = txout->nValue;
    }
    else {
      CVar2 = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return CVar2;
    }
  }
  else {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_60,"OutputGetChange",&local_61);
    std::operator+(&local_40,&local_60,": value out of range");
    std::runtime_error::runtime_error(this,(string *)&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  __stack_chk_fail();
}

Assistant:

CAmount OutputGetChange(const CWallet& wallet, const CTxOut& txout)
{
    AssertLockHeld(wallet.cs_wallet);
    if (!MoneyRange(txout.nValue))
        throw std::runtime_error(std::string(__func__) + ": value out of range");
    return (OutputIsChange(wallet, txout) ? txout.nValue : 0);
}